

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O2

CURLcode Curl_cf_setup_insert_after
                   (Curl_cfilter *cf_at,Curl_easy *data,Curl_dns_entry *remotehost,int transport,
                   int ssl_mode)

{
  CURLcode CVar1;
  Curl_cfilter *in_RAX;
  Curl_cfilter *cf;
  Curl_cfilter *local_18;
  
  local_18 = in_RAX;
  CVar1 = cf_setup_create(&local_18,(Curl_easy *)remotehost,(Curl_dns_entry *)(ulong)(uint)transport
                          ,ssl_mode,ssl_mode);
  if (CVar1 == CURLE_OK) {
    Curl_conn_cf_insert_after(cf_at,local_18);
  }
  return CVar1;
}

Assistant:

CURLcode Curl_cf_setup_insert_after(struct Curl_cfilter *cf_at,
                                    struct Curl_easy *data,
                                    const struct Curl_dns_entry *remotehost,
                                    int transport,
                                    int ssl_mode)
{
  struct Curl_cfilter *cf;
  CURLcode result;

  DEBUGASSERT(data);
  result = cf_setup_create(&cf, data, remotehost, transport, ssl_mode);
  if(result)
    goto out;
  Curl_conn_cf_insert_after(cf_at, cf);
out:
  return result;
}